

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseUnboundFuncSignature(WastParser *this,FuncSignature *sig)

{
  Result RVar1;
  Enum EVar2;
  
  RVar1 = ParseUnboundValueTypeList(this,Param,&sig->param_types);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    RVar1 = ParseResultList(this,&sig->result_types);
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseUnboundFuncSignature(FuncSignature* sig) {
  WABT_TRACE(ParseUnboundFuncSignature);
  CHECK_RESULT(ParseUnboundValueTypeList(TokenType::Param, &sig->param_types));
  CHECK_RESULT(ParseResultList(&sig->result_types));
  return Result::Ok;
}